

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetworkCommsInterface.cpp
# Opt level: O2

bool __thiscall
helics::NetworkCommsInterface::PortAllocator::isPortUsed
          (PortAllocator *this,string_view host,int port)

{
  const_iterator cVar1;
  size_type sVar2;
  bool bVar3;
  int local_1c;
  key_type local_18;
  
  local_18._M_str = host._M_str;
  local_18._M_len = host._M_len;
  local_1c = port;
  cVar1 = std::
          _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
          ::find(&(this->usedPort)._M_t,&local_18);
  if ((_Rb_tree_header *)cVar1._M_node == &(this->usedPort)._M_t._M_impl.super__Rb_tree_header) {
    bVar3 = false;
  }
  else {
    sVar2 = std::set<int,_std::less<int>,_std::allocator<int>_>::count
                      ((set<int,_std::less<int>,_std::allocator<int>_> *)&cVar1._M_node[1]._M_left,
                       &local_1c);
    bVar3 = sVar2 != 0;
  }
  return bVar3;
}

Assistant:

bool NetworkCommsInterface::PortAllocator::isPortUsed(std::string_view host, int port) const
{
    auto fnd = usedPort.find(host);
    if (fnd == usedPort.end()) {
        return false;
    }
    return (fnd->second.count(port) != 0);
}